

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

bool __thiscall TGAImage::load_rle_data(TGAImage *this,ifstream *in)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  TGAColor colorbuffer;
  uchar local_48 [8];
  ulong local_40;
  ulong local_38;
  
  uVar3 = (ulong)(this->height * this->width);
  local_48[4] = 0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  lVar9 = 0;
  uVar8 = 0;
  while (cVar1 = std::istream::get(), *(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    uVar2 = uVar8;
    if (cVar1 < '\0') {
      std::istream::read((char *)in,(long)local_48);
      if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) {
LAB_00104dfa:
        pcVar6 = "an error occurred while reading the header\n";
        lVar9 = 0x2b;
        goto LAB_00104e22;
      }
      if ((byte)(cVar1 + 0x81) != 0) {
        uVar2 = (uint)(byte)(cVar1 + 0x81) + uVar8;
        uVar7 = (ulong)this->bytespp;
        do {
          if ((int)uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar4 = 0;
            do {
              (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start[uVar4 + lVar9] = local_48[uVar4];
              uVar4 = uVar4 + 1;
              uVar7 = (ulong)this->bytespp;
            } while (uVar4 < uVar7);
            lVar9 = lVar9 + uVar4;
          }
          uVar8 = uVar8 + 1;
          if (uVar3 < uVar8) goto LAB_00104de5;
        } while (uVar8 != uVar2);
      }
    }
    else {
      uVar5 = (uint)(byte)(cVar1 + 1);
      if (uVar5 != 0) {
        local_38 = uVar8 + uVar5;
        uVar7 = 0;
        local_40 = uVar3;
        do {
          std::istream::read((char *)in,(long)local_48);
          if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) goto LAB_00104dfa;
          if (this->bytespp != 0) {
            uVar3 = 0;
            do {
              (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start[uVar3 + lVar9] = local_48[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar3 < this->bytespp);
            lVar9 = lVar9 + uVar3;
          }
          uVar8 = uVar8 + 1;
          if (local_40 < uVar8) goto LAB_00104de5;
          uVar7 = uVar7 + 1;
          uVar3 = local_40;
          uVar2 = local_38;
        } while (uVar7 != uVar5);
      }
    }
    uVar8 = uVar2;
    if (uVar3 <= uVar2) {
      return true;
    }
  }
  pcVar6 = "an error occurred while reading the data\n";
  lVar9 = 0x29;
LAB_00104e22:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar9);
  return false;
LAB_00104de5:
  pcVar6 = "Too many pixels read\n";
  lVar9 = 0x15;
  goto LAB_00104e22;
}

Assistant:

bool TGAImage::load_rle_data(std::ifstream &in)
{
    size_t pixelcount = width * height;
    size_t currentpixel = 0;
    size_t currentbyte = 0;
    TGAColor colorbuffer;
    do {
        std::uint8_t chunkheader = 0;
        chunkheader = in.get();
        if (!in.good()) {
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
        if (chunkheader < 128) {
            chunkheader++;
            for (size_t i = 0; i < chunkheader; i++) {
                in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
                if (!in.good()) {
                    std::cerr << "an error occurred while reading the header\n";
                    return false;
                }
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        } else {
            chunkheader -= 127;
            in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
            if (!in.good()) {
                std::cerr << "an error occurred while reading the header\n";
                return false;
            }
            for (size_t i = 0; i < chunkheader; i++) {
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        }
    } while (currentpixel < pixelcount);
    return true;
}